

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

QMargins __thiscall QLineEditPrivate::effectiveTextMargins(QLineEditPrivate *this)

{
  int iVar1;
  long lVar2;
  LayoutDirection LVar3;
  int iVar4;
  SideWidgetEntryList *pSVar5;
  long in_FS_OFFSET;
  QMargins QVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (this->textMargins).m_left.m_i;
  LVar3 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  pSVar5 = &this->trailingSideWidgets;
  if (LVar3 == LeftToRight) {
    pSVar5 = &this->leadingSideWidgets;
  }
  sideWidgetParameters(this);
  QVar6.m_left.m_i =
       effectiveTextMargin(iVar4,(SideWidgetEntryList *)
                                 (pSVar5->
                                 super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                                 )._M_impl.super__Vector_impl_data._M_start,
                           (SideWidgetParameters *)
                           (pSVar5->
                           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
  iVar4 = (this->textMargins).m_right.m_i;
  iVar1 = (this->textMargins).m_top.m_i;
  LVar3 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  pSVar5 = &this->leadingSideWidgets;
  if (LVar3 == LeftToRight) {
    pSVar5 = &this->trailingSideWidgets;
  }
  sideWidgetParameters(this);
  iVar4 = effectiveTextMargin(iVar4,(SideWidgetEntryList *)
                                    (pSVar5->
                                    super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                              (SideWidgetParameters *)
                              (pSVar5->
                              super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                              )._M_impl.super__Vector_impl_data._M_finish);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    QVar6.m_top.m_i = iVar1;
    QVar6.m_bottom.m_i = (this->textMargins).m_bottom.m_i;
    QVar6.m_right.m_i = iVar4;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QMargins QLineEditPrivate::effectiveTextMargins() const
{
    return {effectiveTextMargin(textMargins.left(), leftSideWidgetList(), sideWidgetParameters()),
            textMargins.top(),
            effectiveTextMargin(textMargins.right(), rightSideWidgetList(), sideWidgetParameters()),
            textMargins.bottom()};
}